

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O0

void __thiscall
Js::StepController::Activate(StepController *this,StepType stepType,InterpreterHaltState *haltState)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  DiagStackFrame **ppDVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  FunctionBody *ptr;
  Recycler *pRVar7;
  FunctionBody *this_00;
  StatementMap *pSVar8;
  undefined4 extraout_var_00;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar9;
  ThreadContext *this_01;
  FunctionBody *functionBody;
  InterpreterHaltState *haltState_local;
  StepType stepType_local;
  StepController *this_local;
  
  this->stepType = stepType;
  iVar3 = InterpreterHaltState::GetCurrentOffset(haltState);
  this->byteOffset = iVar3;
  ppDVar5 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
            Peek(haltState->framePointers,0);
  iVar3 = (*(*ppDVar5)->_vptr_DiagStackFrame[10])();
  this->pActivatedContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  if (this->pActivatedContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                ,0x5b,"(this->pActivatedContext)","this->pActivatedContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ptr = InterpreterHaltState::GetFunction(haltState);
  pRVar7 = ScriptContext::GetRecycler(this->pActivatedContext);
  Memory::RecyclerRootPtr<Js::FunctionBody>::Root(&this->body,ptr,pRVar7);
  this_00 = Memory::RecyclerRootPtr<Js::FunctionBody>::operator->(&this->body);
  pSVar8 = FunctionBody::GetMatchingStatementMapFromByteCode(this_00,this->byteOffset,false);
  this->statementMap = pSVar8;
  iVar3 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Count
                    (haltState->framePointers);
  this->frameCountWhenSet = iVar3;
  if (stepType == STEP_DOCUMENT) {
    this->frameAddrWhenSet = 0xffffffffffffffff;
  }
  else {
    ppDVar5 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
              Peek(haltState->framePointers,0);
    iVar3 = (*(*ppDVar5)->_vptr_DiagStackFrame[4])();
    this->frameAddrWhenSet = CONCAT44(extraout_var_00,iVar3);
  }
  uVar4 = GetScriptId(this,ptr);
  this->scriptIdWhenSet = uVar4;
  if (this->returnedValueList == (ReturnedValueList *)0x0) {
    pRVar7 = ScriptContext::GetRecycler(this->pActivatedContext);
    pLVar9 = JsUtil::
             List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(pRVar7,4);
    this->returnedValueList = pLVar9;
    this_01 = ScriptContext::GetThreadContext(this->pActivatedContext);
    ThreadContext::SetReturnedValueList(this_01,this->returnedValueList);
  }
  return;
}

Assistant:

void StepController::Activate(StepType stepType, InterpreterHaltState* haltState)
    {
        this->stepType = stepType;
        this->byteOffset = haltState->GetCurrentOffset();
        this->pActivatedContext = haltState->framePointers->Peek()->GetScriptContext();
        Assert(this->pActivatedContext);

        Js::FunctionBody* functionBody = haltState->GetFunction();

        this->body.Root(functionBody, this->pActivatedContext->GetRecycler());
        this->statementMap = body->GetMatchingStatementMapFromByteCode(byteOffset, false);
        this->frameCountWhenSet = haltState->framePointers->Count();

        if (stepType != STEP_DOCUMENT)
        {
            this->frameAddrWhenSet = (size_t)haltState->framePointers->Peek(0)->GetStackAddress();
        }
        else
        {
            // for doc mode, do not bail out automatically on frame changes
            this->frameAddrWhenSet = (size_t)-1;
        }

        this->scriptIdWhenSet = GetScriptId(functionBody);

        if (this->returnedValueList == nullptr)
        {
            this->returnedValueList = JsUtil::List<ReturnedValue*>::New(this->pActivatedContext->GetRecycler());
            this->pActivatedContext->GetThreadContext()->SetReturnedValueList(this->returnedValueList);
        }
    }